

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.cxx
# Opt level: O0

void __thiscall Function::unvalidate(Function *this)

{
  Function *this_local;
  
  this->bValueValid = false;
  if (this->xLeft != (Function *)0x0) {
    unvalidate(this->xLeft);
  }
  if (this->xRight != (Function *)0x0) {
    unvalidate(this->xRight);
  }
  if (this->xPlus != (Function *)0x0) {
    unvalidate(this->xPlus);
  }
  return;
}

Assistant:

void Function::unvalidate()
{
	// cout << " unvalidating {" << sName << endl;
	bValueValid = false;
	if (xLeft) xLeft->unvalidate();
	if (xRight) xRight->unvalidate();
	if (xPlus) xPlus->unvalidate();
	// cout << "} end unvaliding" << endl;
}